

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O1

int compute_all_adcq(uint64_t dst,uint64_t src1,uint64_t src3)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = dst <= src1;
  if (src3 == 0) {
    bVar1 = dst < src1;
  }
  lVar2 = dst - (src3 + src1);
  return (uint)bVar1 |
         (~((uint)((ulong)lVar2 >> 0x20) ^ (uint)(src1 >> 0x20)) & (uint)((src1 ^ dst) >> 0x20)) >>
         0x14 & 0x800 |
         (uint)(dst == 0) << 6 | (byte)(dst >> 0x38) & 0xffffff80 |
         ((uint)lVar2 ^ (uint)(src1 ^ dst)) & 0x10 | (uint)"\x04"[dst & 0xff];
}

Assistant:

static int glue(compute_all_adc, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1,
                                         DATA_TYPE src3)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src2 = dst - src1 - src3;

    cf = (src3 ? dst <= src1 : dst < src1);
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & 0x10;
    zf = (dst == 0) << 6;
    sf = lshift(dst, 8 - DATA_BITS) & 0x80;
    of = lshift((src1 ^ src2 ^ -1) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}